

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O0

void __thiscall IteratorTest::constructorTest<true>(IteratorTest *this)

{
  allocator<int> *paVar1;
  undefined1 *puVar2;
  int iVar3;
  bool bVar4;
  char *pcVar5;
  reference piVar6;
  reference piVar7;
  reference piVar8;
  reference pvVar9;
  iterator iVar10;
  iterator iVar11;
  Iterator<int,_true,_std::allocator<unsigned_long>_> *pIVar12;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  int __c_03;
  int __c_04;
  int __c_05;
  int __c_06;
  int __c_07;
  int __c_08;
  char *in_RSI;
  View<int,_true,_std::allocator<unsigned_long>_> *pVVar13;
  View<int,_false,_std::allocator<unsigned_long>_> *pVVar14;
  bool local_1802;
  bool local_17ca;
  bool local_1792;
  bool local_175a;
  bool local_1722;
  bool local_16ea;
  bool local_16b2;
  bool local_167a;
  bool local_1642;
  bool local_160a;
  bool local_15d2;
  bool local_159a;
  bool local_1562;
  bool local_152a;
  bool local_14f2;
  bool local_14ba;
  bool local_1482;
  bool local_144a;
  bool local_13b1;
  iterator local_13b0;
  bool local_137e;
  bool local_137d;
  int local_137c;
  undefined1 local_1378 [4];
  int i;
  Iterator<int,_true,_std::allocator<unsigned_long>_> itc;
  undefined1 local_1318 [8];
  Iterator<int,_false,_std::allocator<unsigned_long>_> it_22;
  undefined1 local_12d0 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_21;
  undefined1 local_1288 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_18;
  bool local_123a;
  bool local_1239;
  ulong local_1238;
  size_t j_17;
  undefined1 local_1228 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_21;
  undefined1 local_11e0 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_20;
  undefined1 local_1198 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_17;
  bool local_114a;
  bool local_1149;
  ulong local_1148;
  size_t j_16;
  undefined1 local_1138 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_20;
  undefined1 local_10f0 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_19;
  undefined1 local_10a8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_16;
  bool local_105a;
  bool local_1059;
  ulong local_1058;
  size_t j_15;
  undefined1 local_1048 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_19;
  undefined1 local_1000 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_18;
  undefined1 local_fb8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_15;
  bool local_f6a;
  bool local_f69;
  ulong local_f68;
  size_t j_14;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_18;
  undefined1 local_f18 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_17;
  undefined1 local_ed0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_14;
  bool local_e82;
  bool local_e81;
  ulong local_e80;
  size_t j_13;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_17;
  undefined1 local_e30 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_16;
  undefined1 local_de8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_13;
  bool local_d9a;
  bool local_d99;
  ulong local_d98;
  size_t j_12;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_16;
  undefined1 local_d48 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_15;
  undefined1 local_d00 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_12;
  bool local_cb2;
  bool local_cb1;
  ulong local_cb0;
  size_t j_11;
  undefined1 local_ca0 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_15;
  undefined1 local_c58 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_14;
  undefined1 local_c10 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_11;
  bool local_bc2;
  bool local_bc1;
  ulong local_bc0;
  size_t j_10;
  undefined1 local_bb0 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_14;
  undefined1 local_b68 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_13;
  undefined1 local_b20 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_10;
  bool local_ad2;
  bool local_ad1;
  ulong local_ad0;
  size_t j_9;
  undefined1 local_ac0 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_13;
  undefined1 local_a78 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_12;
  undefined1 local_a30 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_9;
  bool local_9e2;
  bool local_9e1;
  ulong local_9e0;
  size_t j_8;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_12;
  undefined1 local_990 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_11;
  undefined1 local_948 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_8;
  bool local_8fa;
  bool local_8f9;
  ulong local_8f8;
  size_t j_7;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_11;
  undefined1 local_8a8 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_10;
  undefined1 local_860 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_7;
  bool local_812;
  bool local_811;
  ulong local_810;
  size_t j_6;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_10;
  undefined1 local_7c0 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_9;
  undefined1 local_778 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_6;
  bool local_72a;
  bool local_729;
  ulong local_728;
  size_t j_5;
  undefined1 local_718 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_9;
  undefined1 local_6d0 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_8;
  undefined1 local_688 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_5;
  bool local_63a;
  bool local_639;
  ulong local_638;
  size_t j_4;
  undefined1 local_628 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_8;
  undefined1 local_5e0 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_7;
  undefined1 local_598 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_4;
  bool local_54a;
  bool local_549;
  ulong local_548;
  size_t j_3;
  undefined1 local_538 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_7;
  undefined1 local_4f0 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_6;
  undefined1 local_4a8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_3;
  bool local_45a;
  bool local_459;
  ulong local_458;
  size_t j_2;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_6;
  undefined1 local_408 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_5;
  undefined1 local_3c0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_2;
  bool local_372;
  bool local_371;
  ulong local_370;
  size_t j_1;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_5;
  undefined1 local_320 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_4;
  undefined1 local_2d8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_1;
  bool local_28a;
  bool local_289;
  ulong local_288;
  size_t j;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_4;
  undefined1 local_238 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_3;
  undefined1 local_1f0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  undefined1 local_1d0 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_3;
  undefined1 local_198 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_2;
  int scalar_2;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_2;
  undefined1 local_118 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_1;
  int scalar_1;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_1;
  undefined1 local_98 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v;
  int scalar;
  bool local_41;
  undefined1 local_40 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it;
  IteratorTest *this_local;
  
  it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_40);
  pcVar5 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::index
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_40,in_RSI,__c);
  local_41 = pcVar5 == (char *)0x0;
  test(&local_41);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_40);
  v.geometry_.coordinateOrder_ = 0x2a;
  paVar1 = (allocator<int> *)
           ((long)&it_1.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_98,
             (pointer)&v.geometry_.coordinateOrder_,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_1.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&scalar_1,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_98,0);
  piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&scalar_1);
  iVar3 = *piVar6;
  piVar7 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                     ((View<int,true,std::allocator<unsigned_long>> *)local_98,0);
  v_1.geometry_._55_1_ = iVar3 == *piVar7;
  test((bool *)&v_1.geometry_.field_0x37);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&scalar_1);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_98);
  v_1.geometry_.coordinateOrder_ = 0x2a;
  paVar1 = (allocator<int> *)
           ((long)&it_2.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_118,
             (pointer)&v_1.geometry_.coordinateOrder_,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_2.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&scalar_2,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_118,0);
  piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&scalar_2);
  iVar3 = *piVar6;
  piVar7 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                     ((View<int,true,std::allocator<unsigned_long>> *)local_118,0);
  v_2.geometry_._55_1_ = iVar3 == *piVar7;
  test((bool *)&v_2.geometry_.field_0x37);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&scalar_2);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_118);
  v_2.geometry_.coordinateOrder_ = 0x2a;
  paVar1 = (allocator<int> *)
           ((long)&it_3.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_198,
             (pointer)&v_2.geometry_.coordinateOrder_,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_3.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1d0,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_198,0);
  piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1d0);
  iVar3 = *piVar6;
  piVar8 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)local_198,0);
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = iVar3 == *piVar8;
  test((bool *)((long)&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1d0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_198);
  puVar2 = &v_3.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1f0,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_3.geometry_.field_0x37);
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1f0,0);
  *pvVar9 = 0x18;
  iVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1f0);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1f0);
  paVar1 = (allocator<int> *)
           ((long)&it_4.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_238,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar10._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_4.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_238,0);
  for (local_288 = 0; local_288 < 0x18; local_288 = local_288 + 1) {
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j);
    local_289 = *piVar6 == this->data_[local_288];
    test(&local_289);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            ((iterator *)
             &shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_238);
  bVar4 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&j,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                     &shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_144a = false;
  if (bVar4) {
    pIVar12 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j);
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar12);
    local_144a = *piVar6 == 0x2e;
  }
  local_28a = local_144a;
  test(&local_28a);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_238);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1f0);
  puVar2 = &v_4.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_4.geometry_.field_0x37);
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8,0);
  *pvVar9 = 0x18;
  iVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8);
  paVar1 = (allocator<int> *)
           ((long)&it_5.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_320,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar10._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_5.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_1,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_320,0);
  for (local_370 = 0; local_370 < 0x18; local_370 = local_370 + 1) {
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_1);
    local_371 = *piVar6 == this->data_[local_370];
    test(&local_371);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_1);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            ((const_iterator *)
             &shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_320);
  bVar4 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&j_1,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                     &shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_1482 = false;
  if (bVar4) {
    pIVar12 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_1);
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar12);
    local_1482 = *piVar6 == 0x2e;
  }
  local_372 = local_1482;
  test(&local_372);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_1);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_320);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8);
  puVar2 = &v_5.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3c0,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_5.geometry_.field_0x37);
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3c0,0);
  *pvVar9 = 0x18;
  iVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3c0);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3c0);
  paVar1 = (allocator<int> *)
           ((long)&it_6.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_408,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar10._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_6.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_2,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_408,0);
  for (local_458 = 0; local_458 < 0x18; local_458 = local_458 + 1) {
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_2);
    local_459 = *piVar6 == this->data_[local_458];
    test(&local_459);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_2);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            ((iterator *)
             &shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_408);
  bVar4 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&j_2,
                     (Iterator<int,_false,_std::allocator<unsigned_long>_> *)
                     &shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_14ba = false;
  if (bVar4) {
    pIVar12 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_2);
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar12);
    local_14ba = *piVar6 == 0x2e;
  }
  local_45a = local_14ba;
  test(&local_45a);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
             &shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_2);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_408);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3c0);
  puVar2 = &v_6.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4a8,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_6.geometry_.field_0x37);
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4a8,0);
  *pvVar9 = 0x18;
  iVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4a8);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4a8);
  paVar1 = (allocator<int> *)
           ((long)&it_7.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_4f0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar10._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_7.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  pVVar13 = (View<int,_true,_std::allocator<unsigned_long>_> *)local_4f0;
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_538,pVVar13,0xc);
  pcVar5 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::index
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_538,
                      (char *)pVVar13,__c_00);
  j_3._7_1_ = pcVar5 == (char *)0xc;
  test((bool *)((long)&j_3 + 7));
  for (local_548 = 0xc; local_548 < 0x18; local_548 = local_548 + 1) {
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_538);
    local_549 = *piVar6 == this->data_[local_548];
    test(&local_549);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_538);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            ((iterator *)
             &shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_4f0);
  bVar4 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)local_538,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                     &shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_14f2 = false;
  if (bVar4) {
    pIVar12 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_538);
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar12);
    local_14f2 = *piVar6 == 0x2e;
  }
  local_54a = local_14f2;
  test(&local_54a);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_538);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_4f0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4a8);
  puVar2 = &v_7.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_598,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_7.geometry_.field_0x37);
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_598,0);
  *pvVar9 = 0x18;
  iVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_598);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_598);
  paVar1 = (allocator<int> *)
           ((long)&it_8.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_5e0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar10._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_8.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  pVVar13 = (View<int,_true,_std::allocator<unsigned_long>_> *)local_5e0;
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_628,pVVar13,0xc);
  pcVar5 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::index
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_628,
                      (char *)pVVar13,__c_01);
  j_4._7_1_ = pcVar5 == (char *)0xc;
  test((bool *)((long)&j_4 + 7));
  for (local_638 = 0xc; local_638 < 0x18; local_638 = local_638 + 1) {
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_628);
    local_639 = *piVar6 == this->data_[local_638];
    test(&local_639);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_628);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            ((const_iterator *)
             &shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_5e0);
  bVar4 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)local_628,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                     &shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_152a = false;
  if (bVar4) {
    pIVar12 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_628);
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar12);
    local_152a = *piVar6 == 0x2e;
  }
  local_63a = local_152a;
  test(&local_63a);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_628);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_5e0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_598);
  puVar2 = &v_8.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_688,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_8.geometry_.field_0x37);
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_688,0);
  *pvVar9 = 0x18;
  iVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_688);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_688);
  paVar1 = (allocator<int> *)
           ((long)&it_9.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_6d0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar10._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_9.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  pVVar14 = (View<int,_false,_std::allocator<unsigned_long>_> *)local_6d0;
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_718,pVVar14,0xc);
  pcVar5 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::index
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_718,
                      (char *)pVVar14,__c_02);
  j_5._7_1_ = pcVar5 == (char *)0xc;
  test((bool *)((long)&j_5 + 7));
  for (local_728 = 0xc; local_728 < 0x18; local_728 = local_728 + 1) {
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_718);
    local_729 = *piVar6 == this->data_[local_728];
    test(&local_729);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_718);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            ((iterator *)
             &shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_6d0);
  bVar4 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)local_718,
                     (Iterator<int,_false,_std::allocator<unsigned_long>_> *)
                     &shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_1562 = false;
  if (bVar4) {
    pIVar12 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_718);
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar12);
    local_1562 = *piVar6 == 0x2e;
  }
  local_72a = local_1562;
  test(&local_72a);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
             &shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_718);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_6d0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_688);
  puVar2 = &v_9.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_778,2,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_9.geometry_.field_0x37);
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_778,0);
  *pvVar9 = 6;
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_778,1);
  *pvVar9 = 4;
  iVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_778);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_778);
  paVar1 = (allocator<int> *)
           ((long)&it_10.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_7c0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar10._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_10.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_6,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_7c0,0);
  for (local_810 = 0; local_810 < 0x18; local_810 = local_810 + 1) {
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_6);
    local_811 = *piVar6 == this->data_[local_810];
    test(&local_811);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_6);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            ((iterator *)
             &shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_7c0);
  bVar4 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&j_6,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                     &shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_159a = false;
  if (bVar4) {
    pIVar12 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_6);
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar12);
    local_159a = *piVar6 == 0x2e;
  }
  local_812 = local_159a;
  test(&local_812);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_6);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_7c0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_778);
  puVar2 = &v_10.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_860,2,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_10.geometry_.field_0x37);
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_860,0);
  *pvVar9 = 6;
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_860,1);
  *pvVar9 = 4;
  iVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_860);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_860);
  paVar1 = (allocator<int> *)
           ((long)&it_11.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_8a8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar10._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_11.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_7,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_8a8,0);
  for (local_8f8 = 0; local_8f8 < 0x18; local_8f8 = local_8f8 + 1) {
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_7);
    local_8f9 = *piVar6 == this->data_[local_8f8];
    test(&local_8f9);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_7);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            ((const_iterator *)
             &shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_8a8);
  bVar4 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&j_7,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                     &shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_15d2 = false;
  if (bVar4) {
    pIVar12 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_7);
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar12);
    local_15d2 = *piVar6 == 0x2e;
  }
  local_8fa = local_15d2;
  test(&local_8fa);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_7);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_8a8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_860);
  puVar2 = &v_11.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_948,2,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_11.geometry_.field_0x37);
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_948,0);
  *pvVar9 = 6;
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_948,1);
  *pvVar9 = 4;
  iVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_948);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_948);
  paVar1 = (allocator<int> *)
           ((long)&it_12.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_990,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar10._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_12.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_8,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_990,0);
  for (local_9e0 = 0; local_9e0 < 0x18; local_9e0 = local_9e0 + 1) {
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_8);
    local_9e1 = *piVar6 == this->data_[local_9e0];
    test(&local_9e1);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_8);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            ((iterator *)
             &shape_9.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_990);
  bVar4 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&j_8,
                     (Iterator<int,_false,_std::allocator<unsigned_long>_> *)
                     &shape_9.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_160a = false;
  if (bVar4) {
    pIVar12 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_8);
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar12);
    local_160a = *piVar6 == 0x2e;
  }
  local_9e2 = local_160a;
  test(&local_9e2);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
             &shape_9.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_990);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_948);
  puVar2 = &v_12.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a30,2,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_12.geometry_.field_0x37);
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a30,0);
  *pvVar9 = 6;
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a30,1);
  *pvVar9 = 4;
  iVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a30);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a30);
  paVar1 = (allocator<int> *)
           ((long)&it_13.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_a78,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar10._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_13.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  pVVar13 = (View<int,_true,_std::allocator<unsigned_long>_> *)local_a78;
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_ac0,pVVar13,0xc);
  pcVar5 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::index
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_ac0,
                      (char *)pVVar13,__c_03);
  j_9._7_1_ = pcVar5 == (char *)0xc;
  test((bool *)((long)&j_9 + 7));
  for (local_ad0 = 0xc; local_ad0 < 0x18; local_ad0 = local_ad0 + 1) {
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_ac0);
    local_ad1 = *piVar6 == this->data_[local_ad0];
    test(&local_ad1);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_ac0);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            ((iterator *)
             &shape_10.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_a78);
  bVar4 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)local_ac0,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                     &shape_10.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_1642 = false;
  if (bVar4) {
    pIVar12 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_ac0);
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar12);
    local_1642 = *piVar6 == 0x2e;
  }
  local_ad2 = local_1642;
  test(&local_ad2);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &shape_10.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_ac0);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a78);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a30);
  puVar2 = &v_13.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b20,2,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_13.geometry_.field_0x37);
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b20,0);
  *pvVar9 = 6;
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b20,1);
  *pvVar9 = 4;
  iVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b20);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b20);
  paVar1 = (allocator<int> *)
           ((long)&it_14.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_b68,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar10._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_14.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  pVVar13 = (View<int,_true,_std::allocator<unsigned_long>_> *)local_b68;
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_bb0,pVVar13,0xc);
  pcVar5 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::index
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_bb0,
                      (char *)pVVar13,__c_04);
  j_10._7_1_ = pcVar5 == (char *)0xc;
  test((bool *)((long)&j_10 + 7));
  for (local_bc0 = 0xc; local_bc0 < 0x18; local_bc0 = local_bc0 + 1) {
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_bb0);
    local_bc1 = *piVar6 == this->data_[local_bc0];
    test(&local_bc1);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_bb0);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            ((const_iterator *)
             &shape_11.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_b68);
  bVar4 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)local_bb0,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                     &shape_11.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_167a = false;
  if (bVar4) {
    pIVar12 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_bb0);
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar12);
    local_167a = *piVar6 == 0x2e;
  }
  local_bc2 = local_167a;
  test(&local_bc2);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &shape_11.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_bb0);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_b68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b20);
  puVar2 = &v_14.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c10,2,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_14.geometry_.field_0x37);
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c10,0);
  *pvVar9 = 6;
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c10,1);
  *pvVar9 = 4;
  iVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c10);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c10);
  paVar1 = (allocator<int> *)
           ((long)&it_15.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_c58,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar10._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_15.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  pVVar14 = (View<int,_false,_std::allocator<unsigned_long>_> *)local_c58;
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_ca0,pVVar14,0xc);
  pcVar5 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::index
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_ca0,
                      (char *)pVVar14,__c_05);
  j_11._7_1_ = pcVar5 == (char *)0xc;
  test((bool *)((long)&j_11 + 7));
  for (local_cb0 = 0xc; local_cb0 < 0x18; local_cb0 = local_cb0 + 1) {
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_ca0);
    local_cb1 = *piVar6 == this->data_[local_cb0];
    test(&local_cb1);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_ca0);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            ((iterator *)
             &shape_12.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_c58);
  bVar4 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)local_ca0,
                     (Iterator<int,_false,_std::allocator<unsigned_long>_> *)
                     &shape_12.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_16b2 = false;
  if (bVar4) {
    pIVar12 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_ca0);
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar12);
    local_16b2 = *piVar6 == 0x2e;
  }
  local_cb2 = local_16b2;
  test(&local_cb2);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
             &shape_12.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_ca0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_c58);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c10);
  puVar2 = &v_15.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d00,3,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_15.geometry_.field_0x37);
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d00,0);
  *pvVar9 = 3;
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d00,1);
  *pvVar9 = 4;
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d00,2);
  *pvVar9 = 2;
  iVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d00);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d00);
  paVar1 = (allocator<int> *)
           ((long)&it_16.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_d48,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar10._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_16.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_12,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_d48,0);
  for (local_d98 = 0; local_d98 < 0x18; local_d98 = local_d98 + 1) {
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_12);
    local_d99 = *piVar6 == this->data_[local_d98];
    test(&local_d99);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_12);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            ((iterator *)
             &shape_13.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_d48);
  bVar4 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&j_12,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                     &shape_13.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_16ea = false;
  if (bVar4) {
    pIVar12 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_12);
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar12);
    local_16ea = *piVar6 == 0x2e;
  }
  local_d9a = local_16ea;
  test(&local_d9a);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &shape_13.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_12);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_d48);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d00);
  puVar2 = &v_16.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_de8,3,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_16.geometry_.field_0x37);
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_de8,0);
  *pvVar9 = 3;
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_de8,1);
  *pvVar9 = 4;
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_de8,2);
  *pvVar9 = 2;
  iVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_de8);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_de8);
  paVar1 = (allocator<int> *)
           ((long)&it_17.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_e30,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar10._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_17.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_13,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_e30,0);
  for (local_e80 = 0; local_e80 < 0x18; local_e80 = local_e80 + 1) {
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_13);
    local_e81 = *piVar6 == this->data_[local_e80];
    test(&local_e81);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_13);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            ((const_iterator *)
             &shape_14.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_e30);
  bVar4 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&j_13,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                     &shape_14.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_1722 = false;
  if (bVar4) {
    pIVar12 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_13);
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar12);
    local_1722 = *piVar6 == 0x2e;
  }
  local_e82 = local_1722;
  test(&local_e82);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &shape_14.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_13);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e30);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_de8);
  puVar2 = &v_17.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ed0,3,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_17.geometry_.field_0x37);
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ed0,0);
  *pvVar9 = 3;
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ed0,1);
  *pvVar9 = 4;
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ed0,2);
  *pvVar9 = 2;
  iVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ed0);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ed0);
  paVar1 = (allocator<int> *)
           ((long)&it_18.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_f18,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar10._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_18.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_14,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_f18,0);
  for (local_f68 = 0; local_f68 < 0x18; local_f68 = local_f68 + 1) {
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_14);
    local_f69 = *piVar6 == this->data_[local_f68];
    test(&local_f69);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_14);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            ((iterator *)
             &shape_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_f18);
  bVar4 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)&j_14,
                     (Iterator<int,_false,_std::allocator<unsigned_long>_> *)
                     &shape_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_175a = false;
  if (bVar4) {
    pIVar12 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_14);
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar12);
    local_175a = *piVar6 == 0x2e;
  }
  local_f6a = local_175a;
  test(&local_f6a);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
             &shape_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&j_14);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f18);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ed0);
  puVar2 = &v_18.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_fb8,3,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_18.geometry_.field_0x37);
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_fb8,0);
  *pvVar9 = 3;
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_fb8,1);
  *pvVar9 = 4;
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_fb8,2);
  *pvVar9 = 2;
  iVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_fb8);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_fb8);
  paVar1 = (allocator<int> *)
           ((long)&it_19.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_1000,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar10._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_19.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  pVVar13 = (View<int,_true,_std::allocator<unsigned_long>_> *)local_1000;
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1048,pVVar13,0xc);
  pcVar5 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::index
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1048,
                      (char *)pVVar13,__c_06);
  j_15._7_1_ = pcVar5 == (char *)0xc;
  test((bool *)((long)&j_15 + 7));
  for (local_1058 = 0xc; local_1058 < 0x18; local_1058 = local_1058 + 1) {
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1048);
    local_1059 = *piVar6 == this->data_[local_1058];
    test(&local_1059);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1048);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            ((iterator *)
             &shape_16.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_1000);
  bVar4 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)local_1048,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                     &shape_16.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_1792 = false;
  if (bVar4) {
    pIVar12 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1048);
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar12);
    local_1792 = *piVar6 == 0x2e;
  }
  local_105a = local_1792;
  test(&local_105a);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &shape_16.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1048);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1000);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_fb8);
  puVar2 = &v_19.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_10a8,3,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_19.geometry_.field_0x37);
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_10a8,0);
  *pvVar9 = 3;
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_10a8,1);
  *pvVar9 = 4;
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_10a8,2);
  *pvVar9 = 2;
  iVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_10a8);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_10a8);
  paVar1 = (allocator<int> *)
           ((long)&it_20.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_10f0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar10._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_20.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  pVVar13 = (View<int,_true,_std::allocator<unsigned_long>_> *)local_10f0;
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1138,pVVar13,0xc);
  pcVar5 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::index
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1138,
                      (char *)pVVar13,__c_07);
  j_16._7_1_ = pcVar5 == (char *)0xc;
  test((bool *)((long)&j_16 + 7));
  for (local_1148 = 0xc; local_1148 < 0x18; local_1148 = local_1148 + 1) {
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1138);
    local_1149 = *piVar6 == this->data_[local_1148];
    test(&local_1149);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1138);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            ((const_iterator *)
             &shape_17.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_10f0);
  bVar4 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)local_1138,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                     &shape_17.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_17ca = false;
  if (bVar4) {
    pIVar12 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1138);
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar12);
    local_17ca = *piVar6 == 0x2e;
  }
  local_114a = local_17ca;
  test(&local_114a);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &shape_17.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1138);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_10f0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_10a8);
  puVar2 = &v_20.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1198,3,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_20.geometry_.field_0x37);
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1198,0);
  *pvVar9 = 3;
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1198,1);
  *pvVar9 = 4;
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1198,2);
  *pvVar9 = 2;
  iVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1198);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1198);
  paVar1 = (allocator<int> *)
           ((long)&it_21.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_11e0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar10._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_21.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  pVVar14 = (View<int,_false,_std::allocator<unsigned_long>_> *)local_11e0;
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1228,pVVar14,0xc);
  pcVar5 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::index
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1228,
                      (char *)pVVar14,__c_08);
  j_17._7_1_ = pcVar5 == (char *)0xc;
  test((bool *)((long)&j_17 + 7));
  for (local_1238 = 0xc; local_1238 < 0x18; local_1238 = local_1238 + 1) {
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1228);
    local_1239 = *piVar6 == this->data_[local_1238];
    test(&local_1239);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1228);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            ((iterator *)
             &shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_11e0);
  bVar4 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)local_1228,
                     (Iterator<int,_false,_std::allocator<unsigned_long>_> *)
                     &shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_1802 = false;
  if (bVar4) {
    pIVar12 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1228);
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar12);
    local_1802 = *piVar6 == 0x2e;
  }
  local_123a = local_1802;
  test(&local_123a);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
             &shape_18.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1228);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_11e0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1198);
  puVar2 = &v_21.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1288,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_21.geometry_.field_0x37);
  pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1288,0);
  *pvVar9 = 0x18;
  iVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1288);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1288);
  paVar1 = (allocator<int> *)
           ((long)&it_22.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_12d0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar10._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_22.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1318);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)
             &itc.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_12d0);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1318,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)
             &itc.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
             &itc.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1378,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1318);
  for (local_137c = 0; local_137c < 0x18; local_137c = local_137c + 1) {
    piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1378);
    local_137d = *piVar6 == this->data_[local_137c];
    test(&local_137d);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1378);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            (&local_13b0,(View<int,_false,_std::allocator<unsigned_long>_> *)local_12d0);
  local_137e = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                         ((Iterator<int,true,std::allocator<unsigned_long>> *)local_1378,&local_13b0
                         );
  test(&local_137e);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_13b0);
  pIVar12 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                      ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1378);
  piVar6 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar12);
  local_13b1 = *piVar6 == 0x2e;
  test(&local_13b1);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1378);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_1318);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_12d0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1288);
  return;
}

Assistant:

void IteratorTest::constructorTest(){
    // empty
    {
        andres::Iterator<int, constTarget> it;
        test(it.index() == 0);
    }
    // view and index
    {
        // scalar
        {
            int scalar = 42;
            andres::View<int, constTarget> v(&scalar);
            andres::Iterator<int, constTarget> it(v, 0);
            
            test(*it == v(0));
        }
        {
            int scalar = 42;
            const andres::View<int, true> v(&scalar);
            andres::Iterator<int, true> it(v, 0);
            
            test(*it == v(0));
        }
        {
            int scalar = 42;
            andres::View<int, false> v(&scalar);
            andres::Iterator<int, true> it(v, 0);
            
            test(*it == v(0));
        }
        // 1D
        {
            // zero offset
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, constTarget> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                const andres::View<int, true> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::View<int, false> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            // non-zero offset
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, constTarget> it(v, 12);
                
                test(it.index() == 12
                );
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                const andres::View<int, true> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 12);
                
                test(it.index() == 12
                );
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::View<int, false> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 12);
                
                test(it.index() == 12
                );
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
        }
        // 2D
        {
            // zero offset
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6;
                shape[1] = 4;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, constTarget> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6;
                shape[1] = 4;
                const andres::View<int, true> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6;
                shape[1] = 4;
                andres::View<int, false> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            // non-zero offset
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6;
                shape[1] = 4;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, constTarget> it(v, 12);
                
                test(it.index() == 12);
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6;
                shape[1] = 4;
                const andres::View<int, true> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 12);
                
                test(it.index() == 12);
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6;
                shape[1] = 4;
                andres::View<int, false> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 12);
                
                test(it.index() == 12);
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
        }
        // 3D
        {
            // zero offset
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4;
                shape[2] = 2;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, constTarget> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4;
                shape[2] = 2;
                const andres::View<int, true> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4;
                shape[2] = 2;
                andres::View<int, false> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 0);
                
                for(std::size_t j = 0; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            // non-zero offset
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4;
                shape[2] = 2;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, constTarget> it(v, 12);
                
                test(it.index() == 12);
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4;
                shape[2] = 2;
                const andres::View<int, true> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 12);
                
                test(it.index() == 12);
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4;
                shape[2] = 2;
                andres::View<int, false> v(shape.begin(), shape.end(), data_);
                andres::Iterator<int, true> it(v, 12);
                
                test(it.index() == 12);
                for(std::size_t j = 12; j < 24; ++j){
                    test(*it == data_[j]);
                    ++it;
                }
                test(it == v.end() &&
                      *(--it) == 46);
            }
        }
    }
    // conversion from mutable to const
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, false> it;
        it = v.begin();
        andres::Iterator<int, true> itc(it);

        for(int i = 0; i < 24; ++i){
            test(*itc == data_[i]);
            ++itc;
        }
        test(itc == v.end());
        test(*(--itc)==46);
    }
}